

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate1<std::complex<double>_>::apply
          (QGate1<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  SquareMatrix<std::complex<double>_> *mat1;
  undefined4 in_register_00000084;
  SquareMatrix<std::complex<double>_> local_80;
  undefined1 local_70 [8];
  anon_class_72_5_b506d461 f;
  int qubit;
  int offset_local;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  QGate1<std::complex<double>_> *this_local;
  
  f.m22._M_value._12_4_ = offset;
  iVar1 = (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
  f.m22._M_value._8_4_ = iVar1 + f.m22._M_value._12_4_;
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])();
  mat1 = (SquareMatrix<std::complex<double>_> *)
         std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::data(vector);
  lambda_QGate1<std::complex<double>>
            ((anon_class_72_5_b506d461 *)local_70,(qgates *)(ulong)(uint)(int)(char)op,(Op)&local_80
             ,mat1,(complex<double> *)CONCAT44(in_register_00000084,offset));
  dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_80);
  apply2<qclab::qgates::lambda_QGate1<std::complex<double>>(qclab::Op,qclab::dense::SquareMatrix<std::complex<double>>,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,f.m22._M_value._8_4_,(anon_class_72_5_b506d461 *)local_70);
  return;
}

Assistant:

void QGate1< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_QGate1( op , this->matrix() , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }